

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O2

Result wabt::ParseUint128(char *s,char *end,v128 *out)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  if (s != end) {
    v128::set_zero(out);
    while( true ) {
      uVar5 = (int)*s - 0x30;
      if (9 < uVar5) break;
      uVar7 = *(uint *)out->v;
      uVar6 = uVar5 + *(int *)out->v;
      *(uint *)out->v = uVar6;
      uVar2 = *(uint *)(out->v + 4);
      uVar1 = *(uint *)(out->v + 8);
      uVar5 = (uint)CARRY4(uVar5,uVar7);
      uVar4 = uVar2 + uVar5;
      *(uint *)(out->v + 4) = uVar4;
      uVar7 = (uint)CARRY4(uVar2,uVar5);
      uVar2 = uVar1 + uVar7;
      *(uint *)(out->v + 8) = uVar2;
      uVar5 = *(uint *)(out->v + 0xc);
      uVar7 = (uint)CARRY4(uVar1,uVar7);
      iVar3 = uVar5 + uVar7;
      *(int *)(out->v + 0xc) = iVar3;
      if (CARRY4(uVar5,uVar7)) {
        return (Result)Error;
      }
      if (s + 1 == end) {
        return (Result)Ok;
      }
      uVar5 = ((uVar6 >> 0x1d) - ((int)uVar6 >> 0x1f)) + (uint)CARRY4(uVar6 * 8,uVar6 * 2);
      *(uint *)out->v = uVar6 * 10;
      uVar7 = (uint)CARRY4(uVar4 * 8,uVar4 * 2) + ((uVar4 >> 0x1d) - ((int)uVar4 >> 0x1f)) +
              (uint)CARRY4(uVar4 * 10,uVar5);
      *(uint *)(out->v + 4) = uVar4 * 10 + uVar5;
      *(uint *)(out->v + 8) = uVar2 * 10 + uVar7;
      *(uint *)(out->v + 0xc) =
           iVar3 * 10 + ((uVar2 >> 0x1d) - ((int)uVar2 >> 0x1f)) + (uint)CARRY4(uVar2 * 8,uVar2 * 2)
           + (uint)CARRY4(uVar2 * 10,uVar7);
      s = s + 1;
    }
  }
  return (Result)Error;
}

Assistant:

Result ParseUint128(const char* s, const char* end, v128* out) {
  if (s == end) {
    return Result::Error;
  }

  out->set_zero();

  while (true) {
    uint32_t digit = (*s - '0');
    if (digit > 9) {
      return Result::Error;
    }

    uint32_t carry_into_v1 = 0;
    uint32_t carry_into_v2 = 0;
    uint32_t carry_into_v3 = 0;
    uint32_t overflow = 0;
    out->set_u32(0, AddWithCarry(out->u32(0), digit, &carry_into_v1));
    out->set_u32(1, AddWithCarry(out->u32(1), carry_into_v1, &carry_into_v2));
    out->set_u32(2, AddWithCarry(out->u32(2), carry_into_v2, &carry_into_v3));
    out->set_u32(3, AddWithCarry(out->u32(3), carry_into_v3, &overflow));
    if (overflow) {
      return Result::Error;
    }

    ++s;

    if (s == end) {
      break;
    }

    Mul10(out);
  }
  return Result::Ok;
}